

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int my_aio_write(aiocb *aiocbp)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar1 = fseek((FILE *)aiocbp->aio_fildes,aiocbp->aio_offset,0);
  if (iVar1 == 0) {
    sVar2 = fwrite(aiocbp->aio_buf,1,aiocbp->aio_nbytes,(FILE *)aiocbp->aio_fildes);
    if (sVar2 == aiocbp->aio_nbytes) goto LAB_00106519;
  }
  iVar3 = -1;
LAB_00106519:
  aiocbp->aio_lio_opcode = iVar3;
  return iVar3;
}

Assistant:

int my_aio_write(struct aiocb *aiocbp)
{
   if( (MYFSEEK(aiocbp->aio_fildes, (size_t)aiocbp->aio_offset, SEEK_SET) == 0)
   &&  (fwrite(aiocbp->aio_buf, 1, aiocbp->aio_nbytes, aiocbp->aio_fildes)
       == aiocbp->aio_nbytes) )
   {
      aiocbp->aio_lio_opcode = 0;
   }
   else
   {
      aiocbp->aio_lio_opcode = -1;
   }

   return(aiocbp->aio_lio_opcode);
}